

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

bool __thiscall deqp::gls::UniformBlockCase::render(UniformBlockCase *this,deUint32 program)

{
  RenderContext *context;
  ulong uVar1;
  UniformBlockCase *pUVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  int *piVar6;
  Surface *surface;
  void *__buf;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  Surface pixels;
  deUint16 indices [6];
  float position [16];
  VertexArrayBinding posArray;
  Random rnd;
  Surface local_280;
  int local_260;
  deUint32 local_25c;
  undefined1 local_258 [8];
  void *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  int local_230;
  TextureFormat local_228;
  UniformBlockCase *local_220;
  undefined8 local_218;
  undefined4 local_210;
  string local_208;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 *local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  undefined1 local_1b0 [24];
  int local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  ChannelOrder local_180;
  string *local_178;
  ios_base local_148 [264];
  deRandom local_40;
  long lVar5;
  undefined4 extraout_var_00;
  
  local_228 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_25c = program;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar4);
  local_220 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  piVar6 = (int *)CONCAT44(extraout_var_00,iVar3);
  iVar3 = *piVar6;
  local_260 = 0x80;
  if (iVar3 < 0x80) {
    local_260 = iVar3;
  }
  iVar7 = 0x80;
  if (piVar6[1] < 0x80) {
    iVar7 = piVar6[1];
  }
  dVar4 = deRandom_getUint32(&local_40);
  uVar9 = (ulong)dVar4 % (ulong)((iVar3 - local_260) + 1);
  iVar3 = piVar6[1];
  dVar4 = deRandom_getUint32(&local_40);
  uVar1 = (ulong)dVar4 % (ulong)((iVar3 - iVar7) + 1);
  (**(code **)(lVar5 + 0x1c0))(0x3e000000,0x3e800000,0x3f000000,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4500);
  local_1d8 = &DAT_3f8000003f800000;
  uStack_1d0 = 0x3f80000000000000;
  local_1e8 = 0xbf8000003f800000;
  uStack_1e0 = 0x3f80000000000000;
  local_208.field_2._M_allocated_capacity = 0x3f800000bf800000;
  local_208.field_2._8_8_ = 0x3f80000000000000;
  local_208._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_208._M_string_length._0_4_ = 0;
  local_208._M_string_length._4_4_ = 0x3f800000;
  local_218 = 0x2000200010000;
  local_210 = 0x30001;
  (**(code **)(lVar5 + 0x1a00))(uVar9,uVar1,local_260,iVar7);
  local_280._0_8_ = &local_280.m_pixels.m_cap;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"a_position","");
  local_258._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_250 = (void *)((long)&local_248 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_280._0_8_,(long)local_280.m_pixels.m_ptr + local_280._0_8_);
  pUVar2 = local_220;
  local_230 = 0;
  local_1c0._0_4_ = local_258._0_4_;
  local_1b8._M_p = local_1b0 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_250,local_248._M_allocated_capacity + (long)local_250);
  local_198 = local_230;
  local_190._M_allocated_capacity = 8;
  local_190._8_4_ = 4;
  local_190._12_4_ = 4;
  local_180 = R;
  local_178 = &local_208;
  if (local_250 != (void *)((long)&local_248 + 8)) {
    operator_delete(local_250,local_248._8_8_ + 1);
  }
  if ((size_t *)local_280._0_8_ != &local_280.m_pixels.m_cap) {
    operator_delete((void *)local_280._0_8_,local_280.m_pixels.m_cap + 1);
  }
  local_258 = (undefined1  [8])0x600000000;
  local_250 = (void *)CONCAT44(local_250._4_4_,INDEXTYPE_UINT16);
  local_248._M_allocated_capacity = (size_type)&local_218;
  glu::draw(pUVar2->m_renderCtx,local_25c,1,(VertexArrayBinding *)local_1c0,
            (PrimitiveList *)local_258,(DrawUtilCallback *)0x0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x781);
  if (local_1b8._M_p != local_1b0 + 8) {
    operator_delete(local_1b8._M_p,local_1b0._8_8_ + 1);
  }
  tcu::Surface::Surface(&local_280,local_260,iVar7);
  context = pUVar2->m_renderCtx;
  local_208._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_280.m_pixels.m_cap != (void *)0x0) {
    local_280.m_pixels.m_cap = (size_t)local_280.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1c0,(TextureFormat *)&local_208,local_280.m_width,
             local_280.m_height,1,(void *)local_280.m_pixels.m_cap);
  glu::readPixels(context,(int)uVar9,(int)uVar1,(PixelBufferAccess *)local_1c0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Reading pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x78a);
  if (local_280.m_height < 1) {
    iVar3 = 0;
  }
  else {
    iVar7 = 0;
    iVar8 = 0;
    iVar3 = 0;
    do {
      uVar9 = local_280._0_8_ & 0xffffffff;
      iVar10 = iVar7;
      if (0 < local_280.m_width) {
        do {
          iVar3 = iVar3 + (uint)(*(int *)((long)local_280.m_pixels.m_ptr + (long)iVar10 * 4) != -1);
          iVar10 = iVar10 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar8 = iVar8 + 1;
      iVar7 = iVar7 + local_280.m_width;
    } while (iVar8 != local_280.m_height);
  }
  if (0 < iVar3) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Image","");
    local_258 = (undefined1  [8])&local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"Rendered image","");
    surface = &local_280;
    tcu::LogImage::LogImage
              ((LogImage *)local_1c0,&local_208,(string *)local_258,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1c0,local_228.order,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._16_8_ != &local_190) {
      operator_delete((void *)local_1b0._16_8_,local_190._M_allocated_capacity + 1);
    }
    if (local_1c0 != (undefined1  [8])local_1b0) {
      operator_delete((void *)local_1c0,local_1b0._0_8_ + 1);
    }
    if (local_258 != (undefined1  [8])&local_248) {
      operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_1c0._0_4_ = local_228.order;
    local_1c0._4_4_ = local_228.type;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Image comparison failed, got ",0x1d);
    std::ostream::operator<<((ostringstream *)&local_1b8,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8," non-white pixels",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b8);
    std::ios_base::~ios_base(local_148);
  }
  tcu::Surface::~Surface(&local_280);
  return iVar3 == 0;
}

Assistant:

bool UniformBlockCase::render (deUint32 program) const
{
	tcu::TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	de::Random					rnd				(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget	= m_renderCtx.getRenderTarget();
	const int					viewportW		= de::min(renderTarget.getWidth(),	128);
	const int					viewportH		= de::min(renderTarget.getHeight(),	128);
	const int					viewportX		= rnd.getInt(0, renderTarget.getWidth()		- viewportW);
	const int					viewportY		= rnd.getInt(0, renderTarget.getHeight()	- viewportH);

	gl.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Draw
	{
		const float position[] =
		{
			-1.0f, -1.0f, 0.0f, 1.0f,
			-1.0f, +1.0f, 0.0f, 1.0f,
			+1.0f, -1.0f, 0.0f, 1.0f,
			+1.0f, +1.0f, 0.0f, 1.0f
		};
		const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

		gl.viewport(viewportX, viewportY, viewportW, viewportH);

		glu::VertexArrayBinding posArray = glu::va::Float("a_position", 4, 4, 0, &position[0]);
		glu::draw(m_renderCtx, program, 1, &posArray,
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	// Verify that all pixels are white.
	{
		tcu::Surface	pixels			(viewportW, viewportH);
		int				numFailedPixels = 0;

		glu::readPixels(m_renderCtx, viewportX, viewportY, pixels.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

		for (int y = 0; y < pixels.getHeight(); y++)
		{
			for (int x = 0; x < pixels.getWidth(); x++)
			{
				if (pixels.getPixel(x, y) != tcu::RGBA::white())
					numFailedPixels += 1;
			}
		}

		if (numFailedPixels > 0)
		{
			log << TestLog::Image("Image", "Rendered image", pixels);
			log << TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels" << TestLog::EndMessage;
		}

		return numFailedPixels == 0;
	}
}